

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

double __thiscall VCClusterQuad::energyWithItem(VCClusterQuad *this,VCFace *f)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Vector3d zi;
  Matrix4d Eo;
  Vector3d local_a8;
  Matrix4d local_88;
  
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
       m_storage.m_data.array[0] +
       (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
       m_storage.m_data.array[1] +
       (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
       m_storage.m_data.array[2] +
       (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
       m_storage.m_data.array[3] +
       (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
  ;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
       m_storage.m_data.array[4] +
       (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
  ;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
       m_storage.m_data.array[5] +
       (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
  ;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
       m_storage.m_data.array[6] +
       (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
  ;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
       m_storage.m_data.array[7] +
       (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
  ;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
       m_storage.m_data.array[8] +
       (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
  ;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
       (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
       m_storage.m_data.array[9] +
       (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
  ;
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] =
       (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
       m_storage.m_data.array[10] +
       (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [10];
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
       = (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
         m_storage.m_data.array[0xb] +
         (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0xb];
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc]
       = (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
         m_storage.m_data.array[0xc] +
         (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0xc];
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd]
       = (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
         m_storage.m_data.array[0xd] +
         (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0xd];
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe]
       = (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
         m_storage.m_data.array[0xe] +
         (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0xe];
  local_88.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
       = (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
         m_storage.m_data.array[0xf] +
         (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0xf];
  dVar8 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
  dVar6 = f->area;
  dVar7 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0];
  dVar4 = (this->super_VCCluster).weightedSum.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  dVar5 = (this->super_VCCluster).weightedSum.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  dVar1 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2];
  dVar2 = (this->super_VCCluster).weightedSum.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  dVar3 = (this->super_VCCluster).area;
  center(&local_a8,this,&local_88);
  dVar8 = (dVar8 * dVar6 + dVar5) *
          local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] +
          (dVar1 * dVar6 + dVar2) *
          local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] +
          (dVar6 * dVar7 + dVar4) *
          local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0];
  return (local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] *
          local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] +
          local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] *
          local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] +
         local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0] *
         local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0]) * (dVar6 + dVar3) - (dVar8 + dVar8);
}

Assistant:

double VCClusterQuad::energyWithItem(VCFace* f) {
	Matrix4d Eo = E + f->E;
	Vector3d ws = weightedSum + f->center * f->area;
	double a = area + f->area;
	Vector3d zi = center(Eo);
	return a * zi.dot(zi) - 2 * zi.dot(ws);
}